

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall vm_lookup_ext::copy_ext_from(vm_lookup_ext *this,vm_lookup_ext *old_ext)

{
  uint uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  long lVar3;
  undefined4 uVar4;
  int iVar5;
  vm_lookup_val *pvVar6;
  vm_lookup_val **ppvVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  vm_lookup_val *pvVar11;
  
  uVar4 = *(undefined4 *)&(old_ext->default_value).field_0x4;
  aVar2 = (old_ext->default_value).val;
  (this->default_value).typ = (old_ext->default_value).typ;
  *(undefined4 *)&(this->default_value).field_0x4 = uVar4;
  (this->default_value).val = aVar2;
  uVar1 = old_ext->bucket_cnt;
  uVar9 = (ulong)this->bucket_cnt;
  lVar3 = uVar9 * 8 + 0x20;
  if ((ulong)uVar1 != 0) {
    lVar10 = 0;
    do {
      pvVar6 = (vm_lookup_val *)
               ((long)this +
               (long)old_ext->buckets[lVar10] + (lVar3 - (long)(old_ext->buckets + uVar1)));
      if (old_ext->buckets[lVar10] == (vm_lookup_val *)0x0) {
        pvVar6 = (vm_lookup_val *)0x0;
      }
      this->buckets[lVar10] = pvVar6;
      lVar10 = lVar10 + 1;
    } while (uVar1 != (uint)lVar10);
    uVar9 = (ulong)this->bucket_cnt;
  }
  uVar8 = old_ext->value_cnt;
  pvVar6 = (vm_lookup_val *)(this->buckets + uVar9);
  if (uVar8 != 0) {
    ppvVar7 = old_ext->buckets + old_ext->bucket_cnt;
    do {
      aVar2 = *(anon_union_8_8_cb74652f_for_val *)(ppvVar7 + 1);
      *(vm_lookup_val **)&pvVar6->key = *ppvVar7;
      (pvVar6->key).val = aVar2;
      aVar2 = *(anon_union_8_8_cb74652f_for_val *)(ppvVar7 + 3);
      *(vm_lookup_val **)&pvVar6->val = ppvVar7[2];
      (pvVar6->val).val = aVar2;
      pvVar11 = (vm_lookup_val *)
                ((long)this + ((long)ppvVar7[4] - (long)(old_ext->buckets + uVar1)) + lVar3);
      if (ppvVar7[4] == (vm_lookup_val *)0x0) {
        pvVar11 = (vm_lookup_val *)0x0;
      }
      pvVar6->nxt = pvVar11;
      ppvVar7 = ppvVar7 + 5;
      pvVar6 = pvVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  this->first_free = pvVar6;
  if (this->value_cnt != old_ext->value_cnt) {
    iVar5 = old_ext->value_cnt - this->value_cnt;
    pvVar11 = pvVar6;
    do {
      pvVar6 = pvVar11 + 1;
      pvVar11->nxt = pvVar6;
      (pvVar11->key).typ = 0xd;
      (pvVar11->val).typ = VM_EMPTY;
      iVar5 = iVar5 + 1;
      pvVar11 = pvVar6;
    } while (iVar5 != 0);
  }
  pvVar6[-1].nxt = (vm_lookup_val *)0x0;
  return;
}

Assistant:

void vm_lookup_ext::copy_ext_from(vm_lookup_ext *old_ext)
{
    vm_lookup_val **oldbp;
    vm_lookup_val **newbp;
    vm_lookup_val *oldval;
    vm_lookup_val *newval;
    char *oldbase;
    char *newbase;
    uint i;

    /* the bucket counts must be the same in both extensions */
    assert(bucket_cnt == old_ext->bucket_cnt);

    /* we must have at least as many entries as the old one had */
    assert(value_cnt >= old_ext->value_cnt);

    /* copy the default value */
    default_value = old_ext->default_value;

    /* get the new and old base values for faster pointer arithmetic */
    oldbase = (char *)old_ext->idx_to_val(0);
    newbase = (char *)idx_to_val(0);

    /* copy the hash buckets from the old extension to the new extension */
    for (i = old_ext->bucket_cnt, oldbp = old_ext->buckets, newbp = buckets ;
         i != 0 ; --i, ++newbp, ++oldbp)
    {
        /* copy the bucket pointer, adjusting to our local pointer scheme */
        *newbp = (*oldbp == 0
                  ? 0
                  : (vm_lookup_val *)(((char *)*oldbp - oldbase) + newbase));
    }

    /* copy the values from the old extension to the new extension */
    for (i = old_ext->value_cnt, oldval = old_ext->idx_to_val(0),
         newval = idx_to_val(0) ;
         i != 0 ;
         --i, ++oldval, ++newval)
    {
        /* copy this entry */
        newval->key = oldval->key;
        newval->val = oldval->val;
        newval->nxt = (oldval->nxt == 0
                       ? 0
                       : (vm_lookup_val *)(((char *)oldval->nxt - oldbase)
                                           + newbase));
    }

    /* link all of the remaining free values into the free list */
    first_free = newval;
    for (i = value_cnt - old_ext->value_cnt ; i != 0 ; --i, ++newval)
    {
        /* link this value into the free list */
        newval->nxt = newval + 1;

        /* mark this free value as empty */
        newval->key.set_empty();
        newval->val.set_empty();
    }

    /* terminate the free list */
    (newval - 1)->nxt = 0;
}